

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::CollationIterator::CollationIterator(CollationIterator *this,CollationIterator *other)

{
  int appCap;
  UBool UVar1;
  int64_t ce;
  int32_t local_30;
  int32_t i;
  int32_t length;
  UErrorCode errorCode;
  CollationIterator *local_18;
  CollationIterator *other_local;
  CollationIterator *this_local;
  
  local_18 = other;
  other_local = this;
  UObject::UObject(&this->super_UObject,&other->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationIterator_0049d838;
  this->trie = local_18->trie;
  this->data = local_18->data;
  CEBuffer::CEBuffer(&this->ceBuffer);
  this->cesIndex = local_18->cesIndex;
  this->skipped = (SkippedState *)0x0;
  this->numCpFwd = local_18->numCpFwd;
  this->isNumeric = local_18->isNumeric;
  i = 0;
  appCap = (local_18->ceBuffer).length;
  if ((0 < appCap) &&
     (UVar1 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,appCap,&i), UVar1 != '\0')) {
    for (local_30 = 0; local_30 < appCap; local_30 = local_30 + 1) {
      ce = CEBuffer::get(&local_18->ceBuffer,local_30);
      CEBuffer::set(&this->ceBuffer,local_30,ce);
    }
    (this->ceBuffer).length = appCap;
    return;
  }
  this->cesIndex = 0;
  return;
}

Assistant:

CollationIterator::CollationIterator(const CollationIterator &other)
        : UObject(other),
          trie(other.trie),
          data(other.data),
          cesIndex(other.cesIndex),
          skipped(NULL),
          numCpFwd(other.numCpFwd),
          isNumeric(other.isNumeric) {
    UErrorCode errorCode = U_ZERO_ERROR;
    int32_t length = other.ceBuffer.length;
    if(length > 0 && ceBuffer.ensureAppendCapacity(length, errorCode)) {
        for(int32_t i = 0; i < length; ++i) {
            ceBuffer.set(i, other.ceBuffer.get(i));
        }
        ceBuffer.length = length;
    } else {
        cesIndex = 0;
    }
}